

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayObjectTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::VertexArrayObjectTest::init(VertexArrayObjectTest *this,EVP_PKEY_CTX *ctx)

{
  Random *rnd;
  pointer pBVar1;
  float fVar2;
  pointer pBVar3;
  float fVar4;
  int iVar5;
  int iVar6;
  GLenum GVar7;
  int iVar8;
  float *data;
  ShaderProgram *pSVar9;
  TestError *this_00;
  long lVar10;
  int componentNdx;
  int iVar11;
  deUint8 *componentItr;
  float *pfVar12;
  float fVar13;
  float *local_1f8;
  GLuint buffer;
  ostringstream local_1a8 [376];
  
  rnd = &this->m_random;
  lVar10 = 0;
  do {
    pBVar3 = (this->m_spec).buffers.
             super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(this->m_spec).buffers.
                     super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar3) / 0x28) <= lVar10) {
      pSVar9 = createProgram(this,&(this->m_spec).vao);
      this->m_vaoProgram = pSVar9;
      _buffer = this->m_log;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::operator<<((ostream *)local_1a8,"Program used with Vertex Array Object");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&buffer,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      glu::operator<<(this->m_log,this->m_vaoProgram);
      pSVar9 = createProgram(this,&(this->m_spec).state);
      this->m_stateProgram = pSVar9;
      _buffer = this->m_log;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::operator<<((ostream *)local_1a8,"Program used with Vertex Array State");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&buffer,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      glu::operator<<(this->m_log,this->m_stateProgram);
      if (((this->m_vaoProgram->m_program).m_info.linkOk == true) &&
         (pSVar9 = this->m_stateProgram, (pSVar9->m_program).m_info.linkOk != false)) {
        if (((this->m_spec).useDrawElements == true) &&
           (((this->m_spec).vao.elementArrayBuffer == 0 ||
            ((this->m_spec).state.elementArrayBuffer == 0)))) {
          pSVar9 = (ShaderProgram *)generateIndices(this);
          this->m_indices = (deUint8 *)pSVar9;
        }
        return (int)pSVar9;
      }
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Failed to compile shaders",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                 ,0xfc);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    pBVar1 = pBVar3 + lVar10;
    data = (float *)operator_new__((long)pBVar3[lVar10].size);
    iVar8 = pBVar3[lVar10].stride;
    if (iVar8 == 0) {
      switch(pBVar1->type) {
      case 0x1400:
      case 0x1401:
        iVar8 = pBVar1->componentCount;
        break;
      case 0x1402:
      case 0x1403:
        iVar8 = pBVar1->componentCount * 2;
        break;
      case 0x1404:
      case 0x1405:
      case 0x1406:
        iVar8 = pBVar1->componentCount << 2;
        break;
      default:
        iVar8 = 0;
      }
    }
    local_1f8 = data;
    for (iVar6 = 0; iVar6 < pBVar1->count; iVar6 = iVar6 + 1) {
      pfVar12 = local_1f8;
      for (iVar11 = 0; iVar11 < pBVar1->componentCount; iVar11 = iVar11 + 1) {
        switch(pBVar1->type) {
        case 0x1400:
        case 0x1401:
          iVar5 = de::Random::getInt(rnd,pBVar1->intRangeMin,pBVar1->intRangeMax);
          *(char *)pfVar12 = (char)iVar5;
          pfVar12 = (float *)((long)pfVar12 + 1);
          break;
        case 0x1402:
        case 0x1403:
          iVar5 = de::Random::getInt(rnd,pBVar1->intRangeMin,pBVar1->intRangeMax);
          *(short *)pfVar12 = (short)iVar5;
          pfVar12 = (float *)((long)pfVar12 + 2);
          break;
        case 0x1404:
        case 0x1405:
          fVar4 = (float)de::Random::getInt(rnd,pBVar1->intRangeMin,pBVar1->intRangeMax);
          *pfVar12 = fVar4;
          goto LAB_005bc161;
        case 0x1406:
          fVar4 = pBVar1->floatRangeMin;
          fVar2 = pBVar1->floatRangeMax;
          fVar13 = deRandom_getFloat(&rnd->m_rnd);
          *pfVar12 = fVar13 * (fVar2 - fVar4) + fVar4;
LAB_005bc161:
          pfVar12 = pfVar12 + 1;
        }
      }
      local_1f8 = (float *)((long)local_1f8 + (long)iVar8);
    }
    glwGenBuffers(1,&buffer);
    GVar7 = glwGetError();
    glu::checkError(GVar7,"glGenBuffers(1, &buffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                    ,0xe5);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->m_buffers,&buffer);
    glwBindBuffer(0x8892,buffer);
    GVar7 = glwGetError();
    glu::checkError(GVar7,"glBindBuffer(GL_ARRAY_BUFFER, buffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                    ,0xe8);
    glwBufferData(0x8892,(long)(this->m_spec).buffers.
                               super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar10].size,data,0x88e8);
    GVar7 = glwGetError();
    glu::checkError(GVar7,
                    "glBufferData(GL_ARRAY_BUFFER, m_spec.buffers[bufferNdx].size, data, GL_DYNAMIC_DRAW)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                    ,0xe9);
    glwBindBuffer(0x8892,0);
    GVar7 = glwGetError();
    glu::checkError(GVar7,"glBindBuffer(GL_ARRAY_BUFFER, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                    ,0xea);
    operator_delete__(data);
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

void VertexArrayObjectTest::init (void)
{
	// \note [mika] Index 0 is reserved for 0 buffer
	for (int bufferNdx = 0; bufferNdx < (int)m_spec.buffers.size(); bufferNdx++)
	{
		deUint8* data = createRandomBufferData(m_spec.buffers[bufferNdx]);

		try
		{
			GLuint buffer;
			GLU_CHECK_CALL(glGenBuffers(1, &buffer));
			m_buffers.push_back(buffer);

			GLU_CHECK_CALL(glBindBuffer(GL_ARRAY_BUFFER, buffer));
			GLU_CHECK_CALL(glBufferData(GL_ARRAY_BUFFER, m_spec.buffers[bufferNdx].size, data, GL_DYNAMIC_DRAW));
			GLU_CHECK_CALL(glBindBuffer(GL_ARRAY_BUFFER, 0));

		} catch (...) {
			delete[] data;
			throw;
		}

		delete[] data;
	}

	m_vaoProgram	= createProgram(m_spec.vao);
	m_log << tcu::TestLog::Message << "Program used with Vertex Array Object" << tcu::TestLog::EndMessage;
	m_log << *m_vaoProgram;
	m_stateProgram	= createProgram(m_spec.state);
	m_log << tcu::TestLog::Message << "Program used with Vertex Array State" << tcu::TestLog::EndMessage;
	m_log << *m_stateProgram;

	if (!m_vaoProgram->isOk() || !m_stateProgram->isOk())
		TCU_FAIL("Failed to compile shaders");

	if (m_spec.useDrawElements && (m_spec.vao.elementArrayBuffer == 0 || m_spec.state.elementArrayBuffer == 0))
		m_indices = generateIndices();
}